

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Display.cxx
# Opt level: O2

void __thiscall Fl_Text_Display::draw(Fl_Text_Display *this)

{
  byte bVar1;
  Fl_Scrollbar *pFVar2;
  Fl_Scrollbar *pFVar3;
  int iVar4;
  Fl_Color c;
  int iVar5;
  int iVar6;
  Fl_Surface_Device *pFVar7;
  Fl_Surface_Device *pFVar8;
  int width;
  int height;
  int H;
  int W;
  int end;
  int start;
  
  if (this->mBuffer == (Fl_Text_Buffer *)0x0) {
    Fl_Widget::draw_box((Fl_Widget *)this);
    return;
  }
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x2a])
            (fl_graphics_driver,(ulong)(uint)(this->super_Fl_Group).super_Fl_Widget.x_,
             (ulong)(uint)(this->super_Fl_Group).super_Fl_Widget.y_,
             (ulong)(uint)(this->super_Fl_Group).super_Fl_Widget.w_,
             (ulong)(uint)(this->super_Fl_Group).super_Fl_Widget.h_);
  iVar4 = Fl_Widget::active_r((Fl_Widget *)this);
  c = (this->super_Fl_Group).super_Fl_Widget.color_;
  if (iVar4 == 0) {
    c = fl_inactive(c);
  }
  bVar1 = (this->super_Fl_Group).super_Fl_Widget.damage_;
  if ((char)bVar1 < '\0') {
    pFVar7 = Fl_Surface_Device::surface();
    pFVar8 = &Fl_Display_Device::display_device()->super_Fl_Surface_Device;
    if (pFVar7 != pFVar8) {
      fl_rectf((this->text_area).x,(this->text_area).y,(this->text_area).w,(this->text_area).h,c);
    }
    Fl_Widget::draw_box((Fl_Widget *)this,(uint)(this->super_Fl_Group).super_Fl_Widget.box_,
                        (this->super_Fl_Group).super_Fl_Widget.x_,
                        (this->super_Fl_Group).super_Fl_Widget.y_,
                        (this->super_Fl_Group).super_Fl_Widget.w_,
                        (this->super_Fl_Group).super_Fl_Widget.h_,c);
    fl_rectf((this->text_area).x + -3,(this->text_area).y + -1,3,(this->text_area).h + 2,c);
    fl_rectf((this->text_area).w + (this->text_area).x,(this->text_area).y + -1,3,
             (this->text_area).h + 2,c);
    fl_rectf((this->text_area).x,(this->text_area).y + -1,(this->text_area).w,1,c);
    fl_rectf((this->text_area).x,(this->text_area).h + (this->text_area).y,(this->text_area).w,1,c);
    pFVar2 = this->mVScrollBar;
    if ((((pFVar2->super_Fl_Slider).super_Fl_Valuator.super_Fl_Widget.flags_ & 2) == 0) &&
       (pFVar3 = this->mHScrollBar,
       ((pFVar3->super_Fl_Slider).super_Fl_Valuator.super_Fl_Widget.flags_ & 2) == 0)) {
      fl_rectf((pFVar2->super_Fl_Slider).super_Fl_Valuator.super_Fl_Widget.x_,
               (pFVar3->super_Fl_Slider).super_Fl_Valuator.super_Fl_Widget.y_,
               (pFVar2->super_Fl_Slider).super_Fl_Valuator.super_Fl_Widget.w_,
               (pFVar3->super_Fl_Slider).super_Fl_Valuator.super_Fl_Widget.h_,0x31);
    }
  }
  else if ((bVar1 & 6) != 0) {
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x2a])
              (fl_graphics_driver,(ulong)((this->text_area).x - 3),(ulong)(uint)(this->text_area).y,
               (ulong)((this->text_area).w + 6),(ulong)(uint)(this->text_area).h);
    fl_rectf((this->text_area).x + -3,this->mCursorOldY,3,this->mMaxsize,c);
    fl_rectf((this->text_area).w + (this->text_area).x,this->mCursorOldY,3,this->mMaxsize,c);
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x2e])();
  }
  if (((this->super_Fl_Group).super_Fl_Widget.damage_ & 0x81) != 0) {
    Fl_Widget::damage((Fl_Widget *)this->mVScrollBar,0x80);
    Fl_Widget::damage((Fl_Widget *)this->mHScrollBar,0x80);
  }
  Fl_Group::update_child(&this->super_Fl_Group,(Fl_Widget *)this->mVScrollBar);
  Fl_Group::update_child(&this->super_Fl_Group,(Fl_Widget *)this->mHScrollBar);
  bVar1 = (this->super_Fl_Group).super_Fl_Widget.damage_;
  if ((bVar1 & 0x82) == 0) {
    if ((bVar1 & 4) != 0) {
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x2a])
                (fl_graphics_driver,(ulong)(uint)(this->text_area).x,
                 (ulong)(uint)(this->text_area).y,(ulong)(uint)(this->text_area).w,
                 (ulong)(uint)(this->text_area).h);
      draw_range(this,this->damage_range1_start,this->damage_range1_end);
      if (this->damage_range2_end != -1) {
        draw_range(this,this->damage_range2_start,this->damage_range2_end);
      }
      this->damage_range1_start = -1;
      this->damage_range1_end = -1;
      this->damage_range2_start = -1;
      this->damage_range2_end = -1;
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x2e])();
    }
  }
  else {
    iVar5 = (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x2b])
                      (fl_graphics_driver,(ulong)(uint)(this->text_area).x,
                       (ulong)(uint)(this->text_area).y,(ulong)(uint)(this->text_area).w,
                       (ulong)(uint)(this->text_area).h,&start,&end,&W,&H);
    iVar4 = start;
    iVar6 = end;
    width = W;
    height = H;
    if (iVar5 == 0) {
      iVar4 = (this->text_area).x;
      iVar6 = (this->text_area).y;
      width = (this->text_area).w;
      height = (this->text_area).h;
    }
    draw_text(this,iVar4,iVar6,width,height);
  }
  iVar4 = Fl_Text_Buffer::selection_position(this->mBuffer,&start,&end);
  if (((((this->super_Fl_Group).super_Fl_Widget.damage_ & 0x86) != 0) &&
      (((iVar4 == 0 || (this->mCursorPos < start || end < this->mCursorPos)) &&
       (this->mCursorOn != 0)))) && ((Fl_Text_Display *)Fl::focus_ == this)) {
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x2a])
              (fl_graphics_driver,(ulong)((this->text_area).x - 3),(ulong)(uint)(this->text_area).y,
               (ulong)((this->text_area).w + 6),(ulong)(uint)(this->text_area).h);
    W = 0;
    H = 0;
    iVar6 = position_to_xy(this,this->mCursorPos,&W,&H);
    iVar4 = H;
    if (iVar6 != 0) {
      draw_cursor(this,W,H);
      this->mCursorOldY = iVar4;
    }
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x2e])();
  }
  draw_line_numbers(this,false);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x2e])();
  return;
}

Assistant:

void Fl_Text_Display::draw(void) {
  // don't even try if there is no associated text buffer!
  if (!buffer()) { draw_box(); return; }

  fl_push_clip(x(),y(),w(),h());	// prevent drawing outside widget area

  // background color -- change if inactive
  Fl_Color bgcolor = active_r() ? color() : fl_inactive(color());

  // draw the non-text, non-scrollbar areas.
  if (damage() & FL_DAMAGE_ALL) {
    //    printf("drawing all (box = %d)\n", box());
    if (Fl_Surface_Device::surface() != Fl_Display_Device::display_device()) {
      // if to printer, draw the background
      fl_rectf(text_area.x, text_area.y, text_area.w, text_area.h, bgcolor);
    }
    // draw the box()
    int W = w(), H = h();
    draw_box(box(), x(), y(), W, H, bgcolor);

    if (mHScrollBar->visible())
      W -= scrollbar_width();
    if (mVScrollBar->visible())
      H -= scrollbar_width();

    // left margin
    fl_rectf(text_area.x-LEFT_MARGIN, text_area.y-TOP_MARGIN,
             LEFT_MARGIN, text_area.h+TOP_MARGIN+BOTTOM_MARGIN,
             bgcolor);

    // right margin
    fl_rectf(text_area.x+text_area.w, text_area.y-TOP_MARGIN,
             RIGHT_MARGIN, text_area.h+TOP_MARGIN+BOTTOM_MARGIN,
             bgcolor);

    // top margin
    fl_rectf(text_area.x, text_area.y-TOP_MARGIN,
             text_area.w, TOP_MARGIN, bgcolor);

    // bottom margin
    fl_rectf(text_area.x, text_area.y+text_area.h,
             text_area.w, BOTTOM_MARGIN, bgcolor);

    // draw that little box in the corner of the scrollbars
    if (mVScrollBar->visible() && mHScrollBar->visible())
      fl_rectf(mVScrollBar->x(), mHScrollBar->y(),
               mVScrollBar->w(), mHScrollBar->h(),
               FL_GRAY);
    //draw_line_numbers(true);		// commented out STR# 2621 / LZA
  }
  else if (damage() & (FL_DAMAGE_SCROLL | FL_DAMAGE_EXPOSE)) {
    //    printf("blanking previous cursor extrusions at Y: %d\n", mCursorOldY);
    // CET - FIXME - save old cursor position instead and just draw side needed?
    fl_push_clip(text_area.x-LEFT_MARGIN,
                 text_area.y,
                 text_area.w+LEFT_MARGIN+RIGHT_MARGIN,
                 text_area.h);
    fl_rectf(text_area.x-LEFT_MARGIN, mCursorOldY,
             LEFT_MARGIN, mMaxsize, bgcolor);
    fl_rectf(text_area.x+text_area.w, mCursorOldY,
             RIGHT_MARGIN, mMaxsize, bgcolor);
    fl_pop_clip();
  }

  // draw the scrollbars
  if (damage() & (FL_DAMAGE_ALL | FL_DAMAGE_CHILD)) {
    mVScrollBar->damage(FL_DAMAGE_ALL);
    mHScrollBar->damage(FL_DAMAGE_ALL);
  }
  update_child(*mVScrollBar);
  update_child(*mHScrollBar);

  // draw all of the text
  if (damage() & (FL_DAMAGE_ALL | FL_DAMAGE_EXPOSE)) {
    //printf("drawing all text\n");
    int X, Y, W, H;
    if (fl_clip_box(text_area.x, text_area.y, text_area.w, text_area.h,
                    X, Y, W, H)) {
      // Draw text using the intersected clipping box...
      // (this sets the clipping internally)
      draw_text(X, Y, W, H);
    } else {
      // Draw the whole area...
      draw_text(text_area.x, text_area.y, text_area.w, text_area.h);
    }
  }
  else if (damage() & FL_DAMAGE_SCROLL) {
    // draw some lines of text
    fl_push_clip(text_area.x, text_area.y,
                 text_area.w, text_area.h);
    //printf("drawing text from %d to %d\n", damage_range1_start, damage_range1_end);
    draw_range(damage_range1_start, damage_range1_end);
    if (damage_range2_end != -1) {
      //printf("drawing text from %d to %d\n", damage_range2_start, damage_range2_end);
      draw_range(damage_range2_start, damage_range2_end);
    }
    damage_range1_start = damage_range1_end = -1;
    damage_range2_start = damage_range2_end = -1;
    fl_pop_clip();
  }

  // draw the text cursor
  int start, end;
  int has_selection = buffer()->selection_position(&start, &end);
  if (damage() & (FL_DAMAGE_ALL | FL_DAMAGE_SCROLL | FL_DAMAGE_EXPOSE)
      && (
#ifdef __APPLE__
	  Fl::compose_state ||
#endif
	  !has_selection || mCursorPos < start || mCursorPos > end) &&
      mCursorOn && Fl::focus() == (Fl_Widget*)this ) {
    fl_push_clip(text_area.x-LEFT_MARGIN,
                 text_area.y,
                 text_area.w+LEFT_MARGIN+RIGHT_MARGIN,
                 text_area.h);

    int X = 0, Y = 0;
    if (position_to_xy(mCursorPos, &X, &Y)) {
      draw_cursor(X, Y);
      mCursorOldY = Y;
    }
    //    else puts("position_to_xy() failed - unable to draw cursor!");
    //printf("drew cursor at pos: %d (%d,%d)\n", mCursorPos, X, Y);
    fl_pop_clip();
  }

  // Important to do this at end of this method, otherwise line numbers
  // will not scroll with the text edit area
  draw_line_numbers(true);
    
  fl_pop_clip();
}